

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O1

uint __thiscall
QFragmentMapData<QTextBlockData>::createFragment(QFragmentMapData<QTextBlockData> *this)

{
  quint32 *pqVar1;
  uint uVar2;
  uint uVar3;
  Header *pHVar4;
  undefined1 auVar5 [12];
  
  pHVar4 = (this->field_0).head;
  uVar2 = pHVar4->freelist;
  if (uVar2 == pHVar4->allocated) {
    auVar5 = qCalculateGrowingBlockSize((ulong)(uVar2 + 1),0x48,0);
    pHVar4 = (Header *)realloc(pHVar4,auVar5._0_8_);
    (this->field_0).head = pHVar4;
    pHVar4->allocated = auVar5._8_4_;
    *(undefined4 *)((long)pHVar4 + (ulong)uVar2 * 0x48 + 8) = 0;
  }
  pHVar4 = (this->field_0).head;
  uVar3 = *(uint *)((long)pHVar4 + (ulong)uVar2 * 0x48 + 8);
  if ((uVar3 == 0) && (uVar3 = uVar2 + 1, uVar3 < pHVar4->allocated)) {
    *(undefined4 *)((long)pHVar4 + (ulong)uVar3 * 0x48 + 8) = 0;
  }
  ((this->field_0).head)->freelist = uVar3;
  pqVar1 = &((this->field_0).head)->node_count;
  *pqVar1 = *pqVar1 + 1;
  return uVar2;
}

Assistant:

uint QFragmentMapData<Fragment>::createFragment()
{
    Q_ASSERT(head->freelist <= head->allocated);

    uint freePos = head->freelist;
    if (freePos == head->allocated) {
        // need to create some free space
        auto blockInfo = qCalculateGrowingBlockSize(freePos + 1, fragmentSize);
        Fragment *newFragments = (Fragment *)realloc(fragments, blockInfo.size);
        Q_CHECK_PTR(newFragments);
        fragments = newFragments;
        head->allocated = quint32(blockInfo.elementCount);
        F(freePos).right = 0;
    }

    uint nextPos = F(freePos).right;
    if (!nextPos) {
        nextPos = freePos+1;
        if (nextPos < head->allocated)
            F(nextPos).right = 0;
    }

    head->freelist = nextPos;

    ++head->node_count;

    return freePos;
}